

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibStop(Sfm_Lib_t *p)

{
  Sfm_Lib_t *p_local;
  
  Vec_MemHashFree(p->vTtMem);
  Vec_MemFree(p->vTtMem);
  Vec_IntErase(&p->vLists);
  Vec_IntErase(&p->vCounts);
  Vec_IntErase(&p->vHits);
  Vec_IntErase(&p->vProfs);
  Vec_IntErase(&p->vStore);
  Vec_IntErase(&p->vTemp);
  if (p->pCells != (Mio_Cell2_t *)0x0) {
    free(p->pCells);
    p->pCells = (Mio_Cell2_t *)0x0;
  }
  if (p->pObjs != (Sfm_Fun_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Sfm_Fun_t *)0x0;
  }
  if (p != (Sfm_Lib_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sfm_LibStop( Sfm_Lib_t * p )
{
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    Vec_IntErase( &p->vLists );
    Vec_IntErase( &p->vCounts );
    Vec_IntErase( &p->vHits );
    Vec_IntErase( &p->vProfs );
    Vec_IntErase( &p->vStore );
    Vec_IntErase( &p->vTemp );
    ABC_FREE( p->pCells );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}